

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * upb_Arena_Malloc(upb_Arena *a,size_t size)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 *ptr;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = size + 7 & 0xfffffffffffffff8;
  pcVar2 = a->ptr_dont_copy_me__upb_internal_use_only;
  if (uVar8 <= (ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar2)) {
    if ((char *)((ulong)(pcVar2 + 7) & 0xfffffffffffffff8) != pcVar2) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + uVar8;
    return pcVar2;
  }
  while( true ) {
    pcVar2 = a[1].ptr_dont_copy_me__upb_internal_use_only;
    if (pcVar2 == (char *)0x0) {
      return (void *)0x0;
    }
    pcVar1 = a[3].end_dont_copy_me__upb_internal_use_only;
    if (pcVar1 == (char *)0x0) {
      uVar4 = 0x100;
      uVar5 = 0;
    }
    else {
      uVar5 = (long)a->end_dont_copy_me__upb_internal_use_only -
              (long)a->ptr_dont_copy_me__upb_internal_use_only;
      uVar4 = ((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar1) * 2;
    }
    uVar3 = uVar4;
    if (g_max_block_size <= uVar4) {
      uVar3 = g_max_block_size;
    }
    uVar6 = 0;
    if (uVar8 <= uVar3 - 0x10) {
      uVar6 = (uVar3 - 0x10) - uVar8;
    }
    if ((g_max_block_size > uVar4 && pcVar1 != (char *)0x0) && uVar6 < uVar5) {
      uVar3 = *(long *)(pcVar1 + 8) * 2;
      if (g_max_block_size <= (ulong)(*(long *)(pcVar1 + 8) * 2)) {
        uVar3 = g_max_block_size;
      }
      uVar6 = 0;
      if (uVar8 <= uVar3 - 0x10) {
        uVar6 = (uVar3 - 0x10) - uVar8;
      }
    }
    uVar4 = uVar8 + 0x10;
    if ((uVar6 <= uVar5 && pcVar1 != (char *)0x0) && (uVar3 = uVar4, uVar4 <= g_max_block_size)) {
      uVar7 = (uVar8 >> 1) + *(long *)(pcVar1 + 8);
      uVar3 = g_max_block_size >> 1;
      if (uVar7 < g_max_block_size >> 1) {
        uVar3 = uVar7;
      }
      *(ulong *)(pcVar1 + 8) = uVar3;
      uVar3 = uVar4;
    }
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
    }
    ptr = (undefined8 *)upb_malloc((upb_alloc *)((ulong)pcVar2 & 0xfffffffffffffffe),uVar3);
    if (ptr == (undefined8 *)0x0) {
      return (void *)0x0;
    }
    a[4].ptr_dont_copy_me__upb_internal_use_only =
         a[4].ptr_dont_copy_me__upb_internal_use_only + uVar3;
    if (uVar6 <= uVar5 && pcVar1 != (char *)0x0) {
      ptr[1] = uVar3;
      pcVar2 = a[3].end_dont_copy_me__upb_internal_use_only;
      *ptr = *(undefined8 *)pcVar2;
      *(undefined8 **)pcVar2 = ptr;
      return ptr + 2;
    }
    _upb_Arena_AddBlock(a,ptr,0x10,uVar3);
    pcVar2 = a->ptr_dont_copy_me__upb_internal_use_only;
    uVar4 = (long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar2;
    if (uVar4 < uVar8) break;
    if (uVar8 <= uVar4) {
      if ((char *)((ulong)(pcVar2 + 7) & 0xfffffffffffffff8) != pcVar2) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + uVar8;
      return pcVar2;
    }
  }
  __assert_fail("_upb_ArenaHas_dont_copy_me__upb_internal_use_only(a) >= size",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                ,0x18d,
                "void *_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(upb_Arena *, size_t)"
               );
}

Assistant:

UPB_API_INLINE void* upb_Arena_Malloc(struct upb_Arena* a, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  void* UPB_PRIVATE(_upb_Arena_SlowMalloc)(struct upb_Arena * a, size_t size);

  size = UPB_ALIGN_MALLOC(size);
  const size_t span = size + UPB_ASAN_GUARD_SIZE;
  if (UPB_UNLIKELY(UPB_PRIVATE(_upb_ArenaHas)(a) < span)) {
    return UPB_PRIVATE(_upb_Arena_SlowMalloc)(a, span);
  }

  // We have enough space to do a fast malloc.
  void* ret = a->UPB_ONLYBITS(ptr);
  UPB_ASSERT(UPB_ALIGN_MALLOC((uintptr_t)ret) == (uintptr_t)ret);
  UPB_ASSERT(UPB_ALIGN_MALLOC(size) == size);
  UPB_UNPOISON_MEMORY_REGION(ret, size);

  a->UPB_ONLYBITS(ptr) += span;

  return ret;
}